

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  bool bVar1;
  float lhs;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiViewport *viewport;
  ImVec2 pos;
  ImVec2 next_scroll;
  ImRect rect_rel;
  ImVec2 p;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImGuiWindow *in_stack_ffffffffffffff70;
  ImRect *this;
  float fVar5;
  float fVar6;
  ImVec2 mx;
  ImGuiWindow *in_stack_ffffffffffffff98;
  ImVec2 *pIVar7;
  undefined1 local_48 [8];
  ImVec2 local_40;
  ImVec2 local_38;
  ImRect local_30;
  ImVec2 local_20;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  ImVec2 local_8;
  
  local_10 = GImGui;
  local_18 = GImGui->NavWindow;
  if ((((GImGui->NavDisableHighlight & 1U) == 0) && ((GImGui->NavDisableMouseHover & 1U) != 0)) &&
     (local_18 != (ImGuiWindow *)0x0)) {
    local_30 = WindowRectRelToAbs(in_stack_ffffffffffffff70,
                                  (ImRect *)
                                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if ((local_18->LastFrameActive != local_10->FrameCount) &&
       (((fVar2 = (local_18->ScrollTarget).x, fVar2 != 3.4028235e+38 || (NAN(fVar2))) ||
        ((fVar2 = (local_18->ScrollTarget).y, fVar2 != 3.4028235e+38 || (NAN(fVar2))))))) {
      local_38 = CalcNextScrollFromScrollTargetAndClamp(in_stack_ffffffffffffff98);
      local_40 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(ImVec2 *)0x4ab0fb);
      ImRect::Translate(&local_30,&local_40);
    }
    lhs = (local_10->Style).FramePadding.x * 4.0;
    this = &local_30;
    fVar5 = local_30.Min.x;
    fVar2 = ImRect::GetWidth(this);
    fVar3 = ImMin<float>(lhs,fVar2);
    fVar3 = fVar5 + fVar3;
    fVar2 = (local_10->Style).FramePadding.y;
    fVar6 = local_30.Max.y;
    fVar4 = ImRect::GetHeight(this);
    fVar4 = ImMin<float>(fVar2,fVar4);
    mx = (ImVec2)local_48;
    ImVec2::ImVec2((ImVec2 *)mx,fVar3,fVar6 - fVar4);
    GetMainViewport();
    ::operator+((ImVec2 *)CONCAT44(lhs,in_stack_ffffffffffffff68),(ImVec2 *)0x4ab1ee);
    ImClamp((ImVec2 *)CONCAT44(fVar3,fVar6),(ImVec2 *)CONCAT44(fVar2,fVar5),mx);
    local_8 = ImFloor((ImVec2 *)CONCAT44(lhs,in_stack_ffffffffffffff68));
  }
  else {
    bVar1 = IsMousePosValid(&(GImGui->IO).MousePos);
    if (bVar1) {
      pIVar7 = &(local_10->IO).MousePos;
    }
    else {
      pIVar7 = &local_10->MouseLastValidPos;
    }
    local_20 = *pIVar7;
    ImVec2::ImVec2(&local_8,local_20.x + 1.0,local_20.y);
  }
  return local_8;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}